

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

bool __thiscall QMdiSubWindow::eventFilter(QMdiSubWindow *this,QObject *object,QEvent *event)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar5;
  char16_t *pcVar6;
  undefined1 *puVar7;
  Representation RVar8;
  Representation RVar9;
  Representation RVar10;
  undefined1 uVar11;
  char cVar12;
  bool bVar13;
  byte bVar14;
  LayoutDirection LVar15;
  WindowStates WVar16;
  SubControl SVar17;
  int iVar18;
  long lVar19;
  QPoint QVar20;
  Data *pDVar21;
  QAction *pQVar22;
  QObject *pQVar23;
  QWidget *pQVar24;
  QWidget *pQVar25;
  QStyle *pQVar26;
  QObject *pQVar27;
  int iVar28;
  QMouseEvent *mouseEvent;
  long in_FS_OFFSET;
  double dVar29;
  QStringView QVar30;
  QStringView QVar31;
  QLatin1String QVar32;
  undefined1 auVar33 [16];
  QStringView QVar34;
  QStringView QVar35;
  QStyleOptionTitleBar titleBarOptions;
  QString local_c8;
  QPoint local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  QPoint *pt;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      object = (QObject *)0x0;
      goto LAB_0044fa7a;
    }
    goto LAB_004501e0;
  }
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  pDVar21 = (this_00->systemMenu).wp.d;
  if (((pDVar21 != (Data *)0x0) && (*(int *)(pDVar21 + 4) != 0)) &&
     (pQVar23 = (this_00->systemMenu).wp.value, pQVar23 != (QObject *)0x0)) {
    pQVar27 = (QObject *)0x0;
    if (*(int *)(pDVar21 + 4) != 0) {
      pQVar27 = pQVar23;
    }
    if (pQVar27 != object) goto LAB_0044f88f;
    sVar2 = *(short *)(event + 8);
    if (sVar2 == 0x12) {
      this_00->activeSubControl = SC_None;
      pQVar5 = (this->super_QWidget).data;
      iVar28 = (pQVar5->crect).x2.m_i;
      iVar4 = (pQVar5->crect).x1.m_i;
      iVar18 = QMdiSubWindowPrivate::titleBarHeight(this_00);
      QRegion::QRegion((QRegion *)local_a8,0,0,(iVar28 - iVar4) + 1,iVar18,Rectangle);
      QWidget::update(&this->super_QWidget,(QRegion *)local_a8);
      QRegion::~QRegion((QRegion *)local_a8);
    }
    else if (sVar2 == 5) {
      auVar33 = QEventPoint::globalPosition();
      dVar29 = (double)((ulong)auVar33._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar33._0_8_;
      bVar13 = 2147483647.0 < dVar29;
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      local_b0.xp.m_i =
           (int)(double)(-(ulong)bVar13 & 0x41dfffffffc00000 | ~-(ulong)bVar13 & (ulong)dVar29);
      dVar29 = (double)((ulong)auVar33._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar33._8_8_;
      bVar13 = 2147483647.0 < dVar29;
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      local_b0.yp.m_i =
           (int)(double)(-(ulong)bVar13 & 0x41dfffffffc00000 | ~-(ulong)bVar13 & (ulong)dVar29);
      local_c8.d.d = (Data *)QWidget::mapFromGlobal(&this->super_QWidget,&local_b0);
      pQVar24 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
      local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)local_a8,this_00);
      pQVar26 = QWidget::style(pQVar24);
      SVar17 = (**(code **)(*(long *)pQVar26 + 0xd0))(pQVar26,5,local_a8,&local_c8,pQVar24);
      QIcon::~QIcon(&local_48);
      if (pQStack_60 != (QArrayData *)0x0) {
        LOCK();
        (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQStack_60,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
      this_00->hoveredSubControl = SVar17;
    }
    else if (sVar2 == 4) {
      if (*(int *)(pDVar21 + 4) == 0) {
        pQVar23 = (QObject *)0x0;
      }
      auVar33 = QEventPoint::position();
      dVar29 = (double)((ulong)auVar33._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar33._0_8_;
      bVar13 = 2147483647.0 < dVar29;
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      local_a8._0_4_ =
           (int)(double)(-(ulong)bVar13 & 0x41dfffffffc00000 | ~-(ulong)bVar13 & (ulong)dVar29);
      dVar29 = (double)((ulong)auVar33._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar33._8_8_;
      bVar13 = 2147483647.0 < dVar29;
      if (dVar29 <= -2147483648.0) {
        dVar29 = -2147483648.0;
      }
      local_a8._4_4_ =
           (int)(double)(-(ulong)bVar13 & 0x41dfffffffc00000 | ~-(ulong)bVar13 & (ulong)dVar29);
      pt = (QPoint *)local_a8;
      pQVar22 = QMenu::actionAt((QMenu *)pQVar23,pt);
      iVar28 = (int)pt;
      if ((pQVar22 == (QAction *)0x0) || (cVar12 = QAction::isEnabled(), cVar12 != '\0')) {
        QWidget::close(&this->super_QWidget,iVar28);
      }
    }
    goto LAB_004501ad;
  }
LAB_0044f88f:
  pDVar21 = (this_00->baseWidget).wp.d;
  if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
    pQVar23 = (QObject *)0x0;
  }
  else {
    pQVar23 = (this_00->baseWidget).wp.value;
  }
  if ((pQVar23 == object) || (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0)) {
LAB_0044fa06:
    if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
      pQVar23 = (QObject *)0x0;
    }
    else {
      pQVar23 = (this_00->baseWidget).wp.value;
    }
    uVar1 = *(ushort *)(event + 8);
    if (pQVar23 == object) {
      if (uVar1 < 0x21) {
        if (uVar1 == 10) {
          this_00->currentOperation = None;
          QMdiSubWindowPrivate::updateCursor(this_00);
        }
        else if (uVar1 == 0x11) {
          QMdiSubWindowPrivate::setActive(this_00,true,true);
        }
        else if ((uVar1 == 0x1a) && (this_00->isWidgetHiddenByUs == false)) {
          QWidget::show(&this->super_QWidget);
        }
      }
      else if (uVar1 < 0x66) {
        if (uVar1 == 0x21) goto LAB_0044fa2d;
        if (uVar1 == 0x4c) {
          QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
        }
      }
      else if (uVar1 == 0x66) {
        if (pDVar21 != (Data *)0x0) {
          if (*(int *)(pDVar21 + 4) == 0) {
            pQVar23 = (QObject *)0x0;
          }
          else {
            pQVar23 = (this_00->baseWidget).wp.value;
          }
          if (pQVar23 == object) {
            bVar13 = QWidget::isWindowModified((QWidget *)(this_00->baseWidget).wp.value);
            if (!bVar13) {
              QWidget::windowTitle((QString *)local_a8,(QWidget *)(this_00->baseWidget).wp.value);
              QWidget::windowTitle(&local_c8,&this->super_QWidget);
              bVar14 = 1;
              if (local_98 == (undefined1 *)local_c8.d.size) {
                QVar31.m_data = (storage_type_conflict *)local_a8._8_8_;
                QVar31.m_size = (qsizetype)local_98;
                QVar35.m_data = local_c8.d.ptr;
                QVar35.m_size = (qsizetype)local_98;
                bVar14 = QtPrivate::equalStrings(QVar31,QVar35);
                bVar14 = bVar14 ^ 1;
              }
              if ((QPoint)local_c8.d.d != (QPoint)0x0) {
                LOCK();
                *(int *)local_c8.d.d = *(int *)local_c8.d.d + -1;
                UNLOCK();
                if (*(int *)local_c8.d.d == 0) {
                  QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QPoint)local_a8._0_8_ != (QPoint)0x0) {
                LOCK();
                *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
                UNLOCK();
                if (*(int *)local_a8._0_8_ == 0) {
                  QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                }
              }
              if (bVar14 != 0) goto LAB_004501ad;
            }
            QWidget::windowTitle((QString *)local_a8,&this->super_QWidget);
            QVar32.m_data = (char *)0x3;
            QVar32.m_size = (qsizetype)local_a8;
            lVar19 = QString::indexOf(QVar32,0x665834,CaseInsensitive);
            if ((QPoint)local_a8._0_8_ != (QPoint)0x0) {
              LOCK();
              *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
              UNLOCK();
              if (*(int *)local_a8._0_8_ == 0) {
                QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
              }
            }
            if (lVar19 != -1) {
              QWidget::setWindowModified(&this->super_QWidget,bVar13);
            }
          }
        }
      }
      else if ((uVar1 == 0x69) && (cVar12 = QWindowStateChangeEvent::isOverride(), cVar12 == '\0'))
      {
        uVar3 = *(uint *)(event + 0x10);
        WVar16 = QWidget::windowState((QWidget *)(this_00->baseWidget).wp.value);
        if (((uVar3 & 1) == 0) &&
           (((uint)WVar16.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                   super_QFlagsStorage<Qt::WindowState>.i & 1) != 0)) {
          QWidget::showMinimized(&this->super_QWidget);
        }
        else if (((uVar3 & 2) == 0) &&
                (((uint)WVar16.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                        super_QFlagsStorage<Qt::WindowState>.i & 2) != 0)) {
          QWidget::showMaximized(&this->super_QWidget);
        }
        else if (((uint)WVar16.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                        super_QFlagsStorage<Qt::WindowState>.i & 7) == 0) {
          QWidget::showNormal(&this->super_QWidget);
        }
      }
      goto LAB_004501ad;
    }
    if (uVar1 != 0x21) goto LAB_0044fa5d;
LAB_0044fa2d:
    if (this_00->ignoreWindowTitleChange == false) {
      if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
        pQVar23 = (QObject *)0x0;
      }
      else {
        pQVar23 = (this_00->baseWidget).wp.value;
      }
      if (pQVar23 == object) {
        QMdiSubWindowPrivate::updateWindowTitle(this_00,true);
        QWidget::windowTitle((QString *)local_a8,(QWidget *)(this_00->baseWidget).wp.value);
        QVar20 = (QPoint)(this_00->lastChildWindowTitle).d.d;
        pcVar6 = (this_00->lastChildWindowTitle).d.ptr;
        (this_00->lastChildWindowTitle).d.d = (Data *)local_a8._0_8_;
        (this_00->lastChildWindowTitle).d.ptr = (char16_t *)local_a8._8_8_;
        puVar7 = (undefined1 *)(this_00->lastChildWindowTitle).d.size;
        (this_00->lastChildWindowTitle).d.size = (qsizetype)local_98;
        local_a8._0_8_ = QVar20;
        local_a8._8_8_ = pcVar6;
        local_98 = puVar7;
        if (QVar20 != (QPoint)0x0) {
          LOCK();
          *(int *)QVar20 = *(int *)QVar20 + -1;
          UNLOCK();
          if (*(int *)QVar20 == 0) {
            QArrayData::deallocate((QArrayData *)QVar20,2,0x10);
          }
        }
      }
      else {
        pQVar24 = maximizedButtonsWidget(this);
        if (pQVar24 != (QWidget *)0x0) {
          pDVar21 = (this_00->controlContainer).wp.d;
          if ((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) {
            pQVar23 = (QObject *)0x0;
          }
          else {
            pQVar23 = (this_00->controlContainer).wp.value;
          }
          if (((*(long *)(pQVar23 + 0x30) != 0) && (*(int *)(*(long *)(pQVar23 + 0x30) + 4) != 0))
             && (*(long *)(pQVar23 + 0x38) != 0)) {
            pQVar24 = QMenuBar::cornerWidget
                                (*(QMenuBar **)((this_00->controlContainer).wp.value + 0x38),
                                 TopRightCorner);
            pQVar25 = maximizedButtonsWidget(this);
            if (pQVar24 == pQVar25) {
              QString::clear(&this_00->originalTitle);
              pDVar21 = (this_00->baseWidget).wp.d;
              if (((pDVar21 == (Data *)0x0) || (*(int *)(pDVar21 + 4) == 0)) ||
                 (pQVar24 = (QWidget *)(this_00->baseWidget).wp.value, pQVar24 == (QWidget *)0x0)) {
LAB_004501a3:
                bVar13 = false;
              }
              else {
                QWidget::windowTitle((QString *)local_a8,pQVar24);
                QWidget::windowTitle(&local_c8,&this->super_QWidget);
                if (local_98 == (undefined1 *)local_c8.d.size) {
                  QVar30.m_data = (storage_type_conflict *)local_a8._8_8_;
                  QVar30.m_size = (qsizetype)local_98;
                  QVar34.m_data = local_c8.d.ptr;
                  QVar34.m_size = (qsizetype)local_98;
                  cVar12 = QtPrivate::equalStrings(QVar30,QVar34);
                }
                else {
                  cVar12 = '\0';
                }
                if ((QPoint)local_c8.d.d != (QPoint)0x0) {
                  LOCK();
                  *(int *)local_c8.d.d = *(int *)local_c8.d.d + -1;
                  UNLOCK();
                  if (*(int *)local_c8.d.d == 0) {
                    QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QPoint)local_a8._0_8_ != (QPoint)0x0) {
                  LOCK();
                  *(int *)local_a8._0_8_ = *(int *)local_a8._0_8_ + -1;
                  UNLOCK();
                  if (*(int *)local_a8._0_8_ == 0) {
                    QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                  }
                }
                if (cVar12 == '\0') goto LAB_004501a3;
                bVar13 = true;
              }
              QMdiSubWindowPrivate::updateWindowTitle(this_00,bVar13);
            }
          }
        }
      }
    }
LAB_004501ad:
    uVar11 = QObject::eventFilter((QObject *)this,(QEvent *)object);
  }
  else {
    lVar19 = QMetaObject::cast((QObject *)&QSizeGrip::staticMetaObject);
    if (lVar19 == 0) {
      pDVar21 = (this_00->baseWidget).wp.d;
      goto LAB_0044fa06;
    }
    if ((*(short *)(event + 8) != 2) ||
       (lVar19 = *(long *)&(this->super_QWidget).field_0x8, (*(byte *)(lVar19 + 0x388) & 4) == 0)) {
LAB_0044fa5d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0044fa7a:
        uVar11 = QObject::eventFilter((QObject *)this,(QEvent *)object);
        return (bool)uVar11;
      }
      goto LAB_004501e0;
    }
    pQVar24 = *(QWidget **)(lVar19 + 0x10);
    auVar33 = QEventPoint::globalPosition();
    dVar29 = (double)((ulong)auVar33._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar33._0_8_;
    bVar13 = 2147483647.0 < dVar29;
    if (dVar29 <= -2147483648.0) {
      dVar29 = -2147483648.0;
    }
    local_a8._0_4_ =
         (int)(double)(-(ulong)bVar13 & 0x41dfffffffc00000 | ~-(ulong)bVar13 & (ulong)dVar29);
    dVar29 = (double)((ulong)auVar33._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar33._8_8_;
    bVar13 = 2147483647.0 < dVar29;
    if (dVar29 <= -2147483648.0) {
      dVar29 = -2147483648.0;
    }
    local_a8._4_4_ =
         (int)(double)(-(ulong)bVar13 & 0x41dfffffffc00000 | ~-(ulong)bVar13 & (ulong)dVar29);
    QVar20 = QWidget::mapFromGlobal(pQVar24,(QPoint *)local_a8);
    this_00->mousePressPosition = QVar20;
    pQVar5 = (this->super_QWidget).data;
    RVar8.m_i = (pQVar5->crect).y1.m_i;
    RVar9.m_i = (pQVar5->crect).x2.m_i;
    RVar10.m_i = (pQVar5->crect).y2.m_i;
    (this_00->oldGeometry).x1 = (Representation)(pQVar5->crect).x1.m_i;
    (this_00->oldGeometry).y1 = (Representation)RVar8.m_i;
    (this_00->oldGeometry).x2 = (Representation)RVar9.m_i;
    (this_00->oldGeometry).y2 = (Representation)RVar10.m_i;
    LVar15 = QWidget::layoutDirection(&this->super_QWidget);
    this_00->currentOperation = (LVar15 == LeftToRight) + BottomLeftResize;
    QMdiSubWindowPrivate::enterRubberBandMode(this_00);
    uVar11 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar11;
  }
LAB_004501e0:
  __stack_chk_fail();
}

Assistant:

bool QMdiSubWindow::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QMdiSubWindow);
    if (!object)
        return QWidget::eventFilter(object, event);

#if QT_CONFIG(menu)
    // System menu events.
    if (d->systemMenu && d->systemMenu == object) {
        if (event->type() == QEvent::MouseButtonDblClick) {
            const QMouseEvent *mouseEvent = static_cast<const QMouseEvent *>(event);
            const QAction *action = d->systemMenu->actionAt(mouseEvent->position().toPoint());
            if (!action || action->isEnabled())
                close();
        } else if (event->type() == QEvent::MouseMove) {
            QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
            d->hoveredSubControl = d->getSubControl(mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        } else if (event->type() == QEvent::Hide) {
            d->activeSubControl = QStyle::SC_None;
            update(QRegion(0, 0, width(), d->titleBarHeight()));
        }
        return QWidget::eventFilter(object, event);
    }
#endif

#if QT_CONFIG(sizegrip)
    if (object != d->baseWidget && parent() && qobject_cast<QSizeGrip *>(object)) {
        if (event->type() != QEvent::MouseButtonPress || !testOption(QMdiSubWindow::RubberBandResize))
            return QWidget::eventFilter(object, event);
        const QMouseEvent *mouseEvent = static_cast<QMouseEvent *>(event);
        d->mousePressPosition = parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint());
        d->oldGeometry = geometry();
        d->currentOperation = isLeftToRight() ? QMdiSubWindowPrivate::BottomRightResize
                                              : QMdiSubWindowPrivate::BottomLeftResize;
#if QT_CONFIG(rubberband)
        d->enterRubberBandMode();
#endif
        return true;
    }
#endif

    if (object != d->baseWidget && event->type() != QEvent::WindowTitleChange)
        return QWidget::eventFilter(object, event);

    switch (event->type()) {
    case QEvent::Show:
        d->setActive(true);
        break;
    case QEvent::ShowToParent:
        if (!d->isWidgetHiddenByUs)
            show();
        break;
    case QEvent::WindowStateChange: {
        QWindowStateChangeEvent *changeEvent = static_cast<QWindowStateChangeEvent*>(event);
        if (changeEvent->isOverride())
            break;
        Qt::WindowStates oldState = changeEvent->oldState();
        Qt::WindowStates newState = d->baseWidget->windowState();
        if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized))
            showMinimized();
        else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized))
            showMaximized();
        else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized | Qt::WindowFullScreen)))
            showNormal();
        break;
    }
    case QEvent::Enter:
        d->currentOperation = QMdiSubWindowPrivate::None;
        d->updateCursor();
        break;
    case QEvent::LayoutRequest:
        d->updateGeometryConstraints();
        break;
    case QEvent::WindowTitleChange:
        if (d->ignoreWindowTitleChange)
            break;
        if (object == d->baseWidget) {
            d->updateWindowTitle(true);
            d->lastChildWindowTitle = d->baseWidget->windowTitle();
#if QT_CONFIG(menubar)
        } else if (maximizedButtonsWidget() && d->controlContainer->menuBar() && d->controlContainer->menuBar()
                   ->cornerWidget(Qt::TopRightCorner) == maximizedButtonsWidget()) {
            d->originalTitle.clear();
            if (d->baseWidget && d->baseWidget->windowTitle() == windowTitle())
                d->updateWindowTitle(true);
            else
                d->updateWindowTitle(false);
#endif
        }
        break;
    case QEvent::ModifiedChange: {
        if (object != d->baseWidget)
            break;
        bool windowModified = d->baseWidget->isWindowModified();
        if (!windowModified && d->baseWidget->windowTitle() != windowTitle())
            break;
        if (windowTitle().contains("[*]"_L1))
            setWindowModified(windowModified);
        break;
    }
    default:
        break;
    }
    return QWidget::eventFilter(object, event);
}